

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2AddrModeImm8(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint uVar2;
  DecodeStatus DVar3;
  uint local_3c;
  uint imm;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  imm = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Val,9,4);
  local_3c = fieldFromInstruction_4(Address_local._4_4_,0,9);
  uVar2 = MCInst_getOpcode(pMStack_18);
  if (((((uVar2 == 0xa27) || (uVar2 == 0xa2c)) || (uVar2 == 0xa35)) ||
      (((uVar2 == 0xa3a || (uVar2 == 0xa3c)) || (uVar2 == 0xa41)))) && (RegNo == 0xf)) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    uVar2 = MCInst_getOpcode(pMStack_18);
    if (((uVar2 == 0x942) || (uVar2 == 0x951)) ||
       ((uVar2 == 0x959 ||
        ((((uVar2 == 0x961 || (uVar2 == 0x969)) || (uVar2 == 0xa27)) ||
         ((uVar2 == 0xa35 || (uVar2 == 0xa3c)))))))) {
      local_3c = local_3c | 0x100;
    }
    DVar3 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&imm,DVar3);
    if (_Var1) {
      DVar3 = DecodeT2Imm8(pMStack_18,local_3c,(uint64_t)Decoder_local,_Rn);
      _Var1 = Check(&imm,DVar3);
      if (_Var1) {
        Inst_local._4_4_ = imm;
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeT2AddrModeImm8(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 9, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 9);

	// Thumb stores cannot use PC as dest register.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2STRT:
		case ARM_t2STRBT:
		case ARM_t2STRHT:
		case ARM_t2STRi8:
		case ARM_t2STRHi8:
		case ARM_t2STRBi8:
			if (Rn == 15)
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Some instructions always use an additive offset.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2LDRT:
		case ARM_t2LDRBT:
		case ARM_t2LDRHT:
		case ARM_t2LDRSBT:
		case ARM_t2LDRSHT:
		case ARM_t2STRT:
		case ARM_t2STRBT:
		case ARM_t2STRHT:
			imm |= 0x100;
			break;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeT2Imm8(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}